

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.h
# Opt level: O1

uint32_t SuperFastHash(char *data,uint32_t len,uint32_t hash)

{
  size_t sVar1;
  uint uVar2;
  uint uVar3;
  
  if (data == (char *)0x0) {
    return 0;
  }
  if (len == 0) {
    sVar1 = strlen(data);
    len = (uint32_t)sVar1;
  }
  if (3 < len) {
    uVar3 = len >> 2;
    do {
      uVar2 = (*(ushort *)data + hash) * 0x10000 ^
              ((uint)(byte)*(ushort *)((long)data + 2) << 0xb |
              (uint)*(byte *)((long)data + 3) << 0x13) ^ *(ushort *)data + hash;
      data = (char *)((long)data + 4);
      hash = (uVar2 >> 0xb) + uVar2;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  switch(len & 3) {
  case 0:
    goto switchD_0030e296_caseD_0;
  case 1:
    uVar3 = hash + (int)(char)*(ushort *)data;
    uVar3 = uVar3 * 0x400 ^ uVar3;
    uVar2 = uVar3 >> 1;
    break;
  case 2:
    uVar3 = (*(ushort *)data + hash) * 0x800 ^ *(ushort *)data + hash;
    hash = (uVar3 >> 0x11) + uVar3;
    goto switchD_0030e296_caseD_0;
  case 3:
    uVar3 = (*(ushort *)data + hash) * 0x10000 ^
            (int)(char)*(ushort *)((long)data + 2) << 0x12 ^ *(ushort *)data + hash;
    uVar2 = uVar3 >> 0xb;
  }
  hash = uVar2 + uVar3;
switchD_0030e296_caseD_0:
  uVar3 = hash * 8 ^ hash;
  uVar3 = (uVar3 >> 5) + uVar3;
  uVar3 = uVar3 * 0x10 ^ uVar3;
  uVar3 = (uVar3 >> 0x11) + uVar3;
  uVar3 = uVar3 * 0x2000000 ^ uVar3;
  return (uVar3 >> 6) + uVar3;
}

Assistant:

inline uint32_t SuperFastHash (const char * data, uint32_t len = 0, uint32_t hash = 0) {
uint32_t tmp;
int rem;

    if (!data) return 0;
    if (!len)len = (uint32_t)::strlen(data);

    rem = len & 3;
    len >>= 2;

    /* Main loop */
    for (;len > 0; len--) {
        hash  += get16bits (data);
        tmp    = (get16bits (data+2) << 11) ^ hash;
        hash   = (hash << 16) ^ tmp;
        data  += 2*sizeof (uint16_t);
        hash  += hash >> 11;
    }

    /* Handle end cases */
    switch (rem) {
        case 3: hash += get16bits (data);
                hash ^= hash << 16;
                hash ^= data[sizeof (uint16_t)] << 18;
                hash += hash >> 11;
                break;
        case 2: hash += get16bits (data);
                hash ^= hash << 11;
                hash += hash >> 17;
                break;
        case 1: hash += *data;
                hash ^= hash << 10;
                hash += hash >> 1;
    }

    /* Force "avalanching" of final 127 bits */
    hash ^= hash << 3;
    hash += hash >> 5;
    hash ^= hash << 4;
    hash += hash >> 17;
    hash ^= hash << 25;
    hash += hash >> 6;

    return hash;
}